

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O1

void read_cb(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uint uVar2;
  uv_timer_t *puVar3;
  ulong unaff_RBX;
  uint uVar4;
  uv_connect_t *puVar5;
  uv_tcp_t *puVar6;
  uv_write_t *puVar7;
  uv_stream_t *puVar8;
  undefined1 auStack_38 [16];
  code *pcStack_28;
  undefined1 auStack_20 [16];
  
  if (tcp == (uv_stream_t *)0x0) {
    read_cb_cold_4();
LAB_00180e7b:
    read_cb_cold_2();
LAB_00180e80:
    read_cb_cold_3();
  }
  else {
    if (-1 < nread) {
      if (nread != 4) goto LAB_00180e7b;
      if (*(int *)buf->base == 0x474e4950) {
        return;
      }
      goto LAB_00180e80;
    }
    if (nread == -0xfff) {
      uv_close(tcp,close_cb);
      return;
    }
  }
  read_cb_cold_1();
  puVar5 = (uv_connect_t *)0x1a4e5a;
  uVar4 = 0x23a3;
  pcStack_28 = (code *)0x180ea3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_20);
  if (iVar1 == 0) {
    pcStack_28 = (code *)0x180eb0;
    uVar2 = create_tcp_socket();
    unaff_RBX = (ulong)uVar2;
    pcStack_28 = (code *)0x180eb7;
    puVar5 = (uv_connect_t *)uv_default_loop();
    uVar4 = 0x335a10;
    pcStack_28 = (code *)0x180ec6;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00180f8b;
    puVar6 = &client;
    pcStack_28 = (code *)0x180edc;
    iVar1 = uv_tcp_open();
    puVar5 = (uv_connect_t *)puVar6;
    if (iVar1 != 0) goto LAB_00180f90;
    puVar5 = &connect_req;
    uVar2 = 0x335a10;
    pcStack_28 = (code *)0x180f01;
    iVar1 = uv_tcp_connect(&connect_req,&client,auStack_20,connect1_cb);
    if (iVar1 != 0) goto LAB_00180f95;
    pcStack_28 = (code *)0x180f0e;
    puVar5 = (uv_connect_t *)uv_default_loop();
    uVar2 = 0;
    pcStack_28 = (code *)0x180f18;
    uv_run();
    if (shutdown_cb_called != 1) goto LAB_00180f9a;
    if (shutdown_requested != 1) goto LAB_00180f9f;
    if (connect_cb_called != 1) goto LAB_00180fa4;
    if (write_cb_called < 1) goto LAB_00180fa9;
    if (close_cb_called != 1) goto LAB_00180fae;
    pcStack_28 = (code *)0x180f4a;
    unaff_RBX = uv_default_loop();
    pcStack_28 = (code *)0x180f5e;
    uv_walk(unaff_RBX,close_walk_cb,0);
    uVar2 = 0;
    pcStack_28 = (code *)0x180f68;
    uv_run(unaff_RBX);
    pcStack_28 = (code *)0x180f6d;
    puVar5 = (uv_connect_t *)uv_default_loop();
    pcStack_28 = (code *)0x180f75;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      pcStack_28 = (code *)0x180f7e;
      uv_library_shutdown();
      return;
    }
  }
  else {
    pcStack_28 = (code *)0x180f8b;
    run_test_tcp_write_ready_cold_1();
LAB_00180f8b:
    uVar2 = uVar4;
    pcStack_28 = (code *)0x180f90;
    run_test_tcp_write_ready_cold_2();
LAB_00180f90:
    pcStack_28 = (code *)0x180f95;
    run_test_tcp_write_ready_cold_3();
LAB_00180f95:
    pcStack_28 = (code *)0x180f9a;
    run_test_tcp_write_ready_cold_4();
LAB_00180f9a:
    pcStack_28 = (code *)0x180f9f;
    run_test_tcp_write_ready_cold_5();
LAB_00180f9f:
    pcStack_28 = (code *)0x180fa4;
    run_test_tcp_write_ready_cold_6();
LAB_00180fa4:
    pcStack_28 = (code *)0x180fa9;
    run_test_tcp_write_ready_cold_7();
LAB_00180fa9:
    pcStack_28 = (code *)0x180fae;
    run_test_tcp_write_ready_cold_8();
LAB_00180fae:
    pcStack_28 = (code *)0x180fb3;
    run_test_tcp_write_ready_cold_9();
  }
  pcStack_28 = connect1_cb;
  run_test_tcp_write_ready_cold_10();
  puVar8 = connect_req.handle;
  pcStack_28 = (code *)unaff_RBX;
  if (puVar5 == &connect_req) {
    puVar3 = (uv_timer_t *)puVar5;
    if (uVar2 != 0) goto LAB_0018107e;
    connect_cb_called = connect_cb_called + 1;
    puVar3 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_timer_init(puVar3,&tm);
    if (iVar1 != 0) goto LAB_00181083;
    puVar3 = &tm;
    iVar1 = uv_timer_start(&tm,timer_cb,2000,0);
    if (iVar1 != 0) goto LAB_00181088;
    auStack_38 = uv_buf_init("P",1);
    puVar7 = &write_req;
    iVar1 = uv_write(&write_req,puVar8,auStack_38,1,write1_cb);
    puVar3 = (uv_timer_t *)puVar7;
    if (iVar1 == 0) {
      iVar1 = uv_read_start(puVar8,alloc_cb,read1_cb);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_00181092;
    }
  }
  else {
    connect1_cb_cold_1();
    puVar3 = (uv_timer_t *)puVar5;
LAB_0018107e:
    connect1_cb_cold_2();
LAB_00181083:
    connect1_cb_cold_3();
LAB_00181088:
    connect1_cb_cold_4();
  }
  puVar8 = (uv_stream_t *)puVar3;
  connect1_cb_cold_5();
LAB_00181092:
  connect1_cb_cold_6();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return;
  }
  uv_close(puVar8,0);
  return;
}

Assistant:

static void read_cb(uv_stream_t* stream, ssize_t nread, const uv_buf_t* buf) {
  ASSERT((uv_tcp_t*)stream == &tcp_accepted);
  if (nread < 0) {
    uv_close((uv_handle_t*) stream, NULL);
  } else {
    read_size += nread;
    if (read_size == 16 && client_close == 0)
      do_close(&tcp_accepted);
  }
}